

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeDate(time_t Start,time_t zone,int dstmode,time_t DayOrdinal,time_t DayNumber)

{
  long Start_00;
  tm *ptVar1;
  long Future;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  time_t now;
  time_t t;
  tm_conflict *tm;
  long local_50;
  time_t local_8;
  
  Start_00 = in_RDI - in_RSI;
  ptVar1 = gmtime((time_t *)&stack0xffffffffffffffc0);
  local_50 = in_RCX;
  if (0 < in_RCX) {
    local_50 = in_RCX + -1;
  }
  Future = local_50 * 0x93a80 + (((in_R8 - ptVar1->tm_wday) + 7) % 7) * 0x15180 + in_RDI;
  if (in_EDX == 2) {
    local_8 = DSTcorrect(Start_00,Future);
  }
  else {
    local_8 = Future - in_RDI;
  }
  return local_8;
}

Assistant:

static time_t
RelativeDate(time_t Start, time_t zone, int dstmode,
    time_t DayOrdinal, time_t DayNumber)
{
	struct tm	*tm;
	time_t	t, now;

	t = Start - zone;
	tm = gmtime(&t);
	now = Start;
	now += DAY * ((DayNumber - tm->tm_wday + 7) % 7);
	now += 7 * DAY * (DayOrdinal <= 0 ? DayOrdinal : DayOrdinal - 1);
	if (dstmode == DSTmaybe)
		return DSTcorrect(Start, now);
	return now - Start;
}